

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

Allocation __thiscall
density::
heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
::external_allocate<2ul>
          (heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
           *this,size_t i_size,size_t i_alignment)

{
  void *pvVar1;
  ulong uVar2;
  Allocation AVar4;
  undefined8 *puVar3;
  
  pvVar1 = density_tests::DeepTestAllocator<256UL>::allocate
                     ((DeepTestAllocator<256UL> *)this,i_size,i_alignment,0);
  AVar4 = inplace_allocate<2ul,true>(this,0x18,8);
  puVar3 = (undefined8 *)AVar4.m_user_storage;
  *puVar3 = pvVar1;
  puVar3[1] = i_size;
  puVar3[2] = i_alignment;
  uVar2 = (AVar4.m_control_block)->m_next;
  if ((uVar2 & 4) != 0) {
    density_tests::detail::assert_failed<>
              ("(inplace_put.m_control_block->m_next & detail::Queue_External) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0xb09);
    uVar2 = (AVar4.m_control_block)->m_next;
  }
  (AVar4.m_control_block)->m_next = uVar2 | 4;
  AVar4.m_user_storage = pvVar1;
  return AVar4;
}

Assistant:

Allocation external_allocate(size_t i_size, size_t i_alignment)
        {
            auto const external_block = ALLOCATOR_TYPE::allocate(i_size, i_alignment);
            try
            {
                /* external blocks always allocate space for the type, because it would be complicated
                    for the consumers to handle both cases*/
                auto const inplace_put = inplace_allocate<CONTROL_BITS, true>(
                  sizeof(ExternalBlock), alignof(ExternalBlock));

                new (inplace_put.m_user_storage) ExternalBlock{external_block, i_size, i_alignment};

                DENSITY_ASSERT((inplace_put.m_control_block->m_next & detail::Queue_External) == 0);
                inplace_put.m_control_block->m_next |= detail::Queue_External;
                return Allocation{inplace_put.m_control_block, external_block};
            }
            catch (...)
            {
                /* if inplace_allocate fails, that means that we were able to allocate the external block,
                    but we were not able to put the struct ExternalBlock in the page (because a new page was
                    necessary, but we could not allocate it). */
                ALLOCATOR_TYPE::deallocate(external_block, i_size, i_alignment);
                throw;
            }
        }